

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

size_t __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSizeLong(CodeGeneratorRequest *this)

{
  int iVar1;
  int iVar2;
  anon_union_96_1_493b367e_for_CodeGeneratorRequest_3 aVar3;
  uint uVar4;
  uint uVar5;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar6;
  size_t sVar7;
  Rep *pRVar8;
  size_t sVar9;
  uint index;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *pRVar10;
  ulong uVar11;
  long lVar12;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *pRVar13;
  int n;
  
  uVar5 = *(uint *)((long)&this->field_0 + 0x10);
  uVar11 = (ulong)uVar5;
  if (0 < (int)uVar5) {
    index = 0;
    do {
      pVVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.file_to_generate_.super_RepeatedPtrFieldBase,index
                         );
      uVar4 = (uint)pVVar6->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar11 = uVar11 + pVVar6->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar5 != index);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  pRVar10 = &(this->field_0)._impl_.proto_file_;
  pRVar13 = pRVar10;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&pRVar10->super_RepeatedPtrFieldBase);
    pRVar13 = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)pRVar8->elements;
    if (((ulong)(pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar8 = internal::RepeatedPtrFieldBase::rep(&pRVar10->super_RepeatedPtrFieldBase);
      pRVar10 = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)pRVar8->elements;
    }
  }
  lVar12 = uVar11 + (long)iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar13 !=
         (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
         (&(pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar13 = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
                &(pRVar13->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = FileDescriptorProto::ByteSizeLong
                      ((FileDescriptorProto *)
                       (pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar5 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar12 = lVar12 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  pRVar10 = &(this->field_0)._impl_.source_file_descriptors_;
  pRVar13 = pRVar10;
  if ((*(byte *)((long)&this->field_0 + 0x38) & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&pRVar10->super_RepeatedPtrFieldBase);
    pRVar13 = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)pRVar8->elements;
    if (((ulong)(pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar8 = internal::RepeatedPtrFieldBase::rep(&pRVar10->super_RepeatedPtrFieldBase);
      pRVar10 = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)pRVar8->elements;
    }
  }
  sVar7 = (long)iVar1 * 2 + lVar12;
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  for (; pRVar13 !=
         (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
         (&(pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar13 = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
                &(pRVar13->super_RepeatedPtrFieldBase).current_size_) {
    sVar9 = FileDescriptorProto::ByteSizeLong
                      ((FileDescriptorProto *)
                       (pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar5 = (uint)sVar9 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar7 = sVar7 + sVar9 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  aVar3 = this->field_0;
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x3) != (undefined1  [96])0x0) {
    if (((undefined1  [96])aVar3 & (undefined1  [96])0x1) != (undefined1  [96])0x0) {
      lVar12 = *(long *)(((ulong)(this->field_0)._impl_.parameter_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar12 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + lVar12 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [96])aVar3 & (undefined1  [96])0x2) != (undefined1  [96])0x0) {
      sVar9 = Version::ByteSizeLong((this->field_0)._impl_.compiler_version_);
      uVar5 = (uint)sVar9 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar9 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar7 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t CodeGeneratorRequest::ByteSizeLong() const {
  const CodeGeneratorRequest& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string file_to_generate = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_file_to_generate().size());
      for (int i = 0, n = this_._internal_file_to_generate().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_file_to_generate().Get(i));
      }
    }
    // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
    {
      total_size += 1UL * this_._internal_proto_file_size();
      for (const auto& msg : this_._internal_proto_file()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.FileDescriptorProto source_file_descriptors = 17;
    {
      total_size += 2UL * this_._internal_source_file_descriptors_size();
      for (const auto& msg : this_._internal_source_file_descriptors()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional string parameter = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_parameter());
    }
    // optional .google.protobuf.compiler.Version compiler_version = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.compiler_version_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}